

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iothubtransporthttp.c
# Opt level: O3

void IoTHubTransportHttp_DoWork(TRANSPORT_LL_HANDLE handle)

{
  HTTPTRANSPORT_PERDEVICE_DATA *deviceData;
  DLIST_ENTRY_TAG *pDVar1;
  HTTP_HEADERS_HANDLE httpHeadersHandle;
  HTTPAPIEX_HANDLE pHVar2;
  HTTPAPIEX_SAS_HANDLE pHVar3;
  char cVar4;
  _Bool _Var5;
  int iVar6;
  HTTP_HEADERS_RESULT HVar7;
  IOTHUBMESSAGE_CONTENT_TYPE IVar8;
  IOTHUB_MESSAGE_RESULT IVar9;
  MAP_RESULT MVar10;
  HTTPAPIEX_RESULT HVar11;
  undefined8 *puVar12;
  STRING_HANDLE pSVar13;
  LOGGER_LOG UNRECOVERED_JUMPTABLE;
  STRING_HANDLE pSVar14;
  MAP_HANDLE pMVar15;
  PDLIST_ENTRY pDVar16;
  size_t sVar17;
  size_t sVar18;
  BUFFER_HANDLE pBVar19;
  uchar *source_00;
  PDLIST_ENTRY pDVar20;
  time_t stopTime;
  HTTP_HEADERS_HANDLE responseHeadersHandle;
  size_t sVar21;
  anon_union_8_2_082bde7f_for_value aVar22;
  MESSAGE_DISPOSITION_CONTEXT *dispositionContext;
  anon_union_8_2_082bde7f_for_value in_RCX;
  char *pcVar23;
  char *pcVar24;
  long lVar25;
  size_t index;
  ulong uVar26;
  double dVar27;
  uchar *source;
  size_t originalMessageSize;
  size_t propertiesSize;
  size_t size;
  uchar *messageContent;
  anon_union_8_2_082bde7f_for_value local_90;
  anon_union_8_2_082bde7f_for_value local_80;
  PDLIST_ENTRY local_78;
  BUFFER_HANDLE local_70;
  STRING_HANDLE local_68;
  size_t local_60;
  anon_union_8_2_082bde7f_for_value local_58;
  anon_union_8_2_082bde7f_for_value local_50;
  MAP_HANDLE local_48;
  STRING_HANDLE local_40;
  size_t local_38;
  
  if (handle == (TRANSPORT_LL_HANDLE)0x0) {
    UNRECOVERED_JUMPTABLE = xlogging_get_log_function();
    if (UNRECOVERED_JUMPTABLE != (LOGGER_LOG)0x0) {
      (*UNRECOVERED_JUMPTABLE)
                (AZ_LOG_ERROR,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothubtransporthttp.c"
                 ,"IoTHubTransportHttp_DoWork",0x83d,1,"Invalid Argument NULL call on DoWork.");
      return;
    }
  }
  else {
    local_38 = VECTOR_size(*(VECTOR_HANDLE *)((long)handle + 0x18));
    if (local_38 != 0) {
      index = 0;
      do {
        puVar12 = (undefined8 *)VECTOR_element(*(VECTOR_HANDLE *)((long)handle + 0x18),index);
        deviceData = (HTTPTRANSPORT_PERDEVICE_DATA *)*puVar12;
        iVar6 = DList_IsListEmpty(deviceData->waitingToSend);
        if (iVar6 != 0) goto LAB_0012b8af;
        if (*(char *)((long)handle + 0x10) == '\x01') {
          HVar7 = HTTPHeaders_ReplaceHeaderNameValuePair
                            (deviceData->eventHTTPrequestHeaders,"Content-Type",
                             "application/vnd.microsoft.iothub.json");
          if (HVar7 == HTTP_HEADERS_OK) {
            pSVar13 = STRING_construct("[");
            if (pSVar13 == (STRING_HANDLE)0x0) {
              UNRECOVERED_JUMPTABLE = xlogging_get_log_function();
              if (UNRECOVERED_JUMPTABLE != (LOGGER_LOG)0x0) {
                in_RCX = (anon_union_8_2_082bde7f_for_value)0x56a;
                (*UNRECOVERED_JUMPTABLE)
                          (AZ_LOG_ERROR,
                           "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothubtransporthttp.c"
                           ,"makePayload",0x56a,1,"unable to STRING_construct");
              }
LAB_0012b87b:
              UNRECOVERED_JUMPTABLE = xlogging_get_log_function();
              if (UNRECOVERED_JUMPTABLE != (LOGGER_LOG)0x0) {
                in_RCX = (anon_union_8_2_082bde7f_for_value)0x629;
                pcVar23 = "unrecoverable errors while building a batch message";
                goto LAB_0012b8aa;
              }
            }
            else {
              local_78 = &deviceData->eventConfirmations;
              pDVar16 = deviceData->waitingToSend->Flink;
              local_68 = pSVar13;
              if (pDVar16 != deviceData->waitingToSend) {
                in_RCX._0_1_ = 1;
                lVar25 = 0;
                do {
                  local_70 = (BUFFER_HANDLE)CONCAT44(local_70._4_4_,in_RCX._0_4_);
                  IVar8 = IoTHubMessage_GetContentType((IOTHUB_MESSAGE_HANDLE)pDVar16[-2].Blink);
                  if (IVar8 == IOTHUBMESSAGE_STRING) {
                    pSVar13 = STRING_construct("{\"body\":");
                    if (pSVar13 == (STRING_HANDLE)0x0) {
                      UNRECOVERED_JUMPTABLE = xlogging_get_log_function();
                      if (UNRECOVERED_JUMPTABLE != (LOGGER_LOG)0x0) {
                        in_RCX = (anon_union_8_2_082bde7f_for_value)0x523;
LAB_0012af1c:
                        pcVar23 = "unable to STRING_construct";
                        goto LAB_0012af29;
                      }
                      goto LAB_0012b09b;
                    }
                    pcVar23 = IoTHubMessage_GetString((IOTHUB_MESSAGE_HANDLE)pDVar16[-2].Blink);
                    if (pcVar23 == (char *)0x0) {
                      UNRECOVERED_JUMPTABLE = xlogging_get_log_function();
                      if (UNRECOVERED_JUMPTABLE != (LOGGER_LOG)0x0) {
                        in_RCX = (anon_union_8_2_082bde7f_for_value)0x52a;
                        pcVar23 = "unable to IoTHubMessage_GetString";
LAB_0012b08e:
                        (*UNRECOVERED_JUMPTABLE)
                                  (AZ_LOG_ERROR,
                                   "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothubtransporthttp.c"
                                   ,"make1EventJSONitem",in_RCX._0_4_,1,pcVar23);
                      }
LAB_0012b093:
                      STRING_delete(pSVar13);
                      goto LAB_0012b09b;
                    }
                    pSVar14 = STRING_new_JSON(pcVar23);
                    if (pSVar14 == (STRING_HANDLE)0x0) {
                      UNRECOVERED_JUMPTABLE = xlogging_get_log_function();
                      if (UNRECOVERED_JUMPTABLE != (LOGGER_LOG)0x0) {
                        in_RCX = (anon_union_8_2_082bde7f_for_value)0x533;
                        pcVar23 = "unable to STRING_new_JSON";
                        goto LAB_0012b08e;
                      }
                      goto LAB_0012b093;
                    }
                    local_80.byteArray = (BUFFER_HANDLE)0x0;
                    local_40 = pSVar14;
                    iVar6 = STRING_concat_with_STRING(pSVar13,pSVar14);
                    if ((iVar6 == 0) &&
                       (iVar6 = STRING_concat(pSVar13,",\"base64Encoded\":false"), iVar6 == 0)) {
                      pMVar15 = IoTHubMessage_Properties((IOTHUB_MESSAGE_HANDLE)pDVar16[-2].Blink);
                      iVar6 = concat_Properties(pSVar13,pMVar15,(size_t *)&local_80);
                      if ((iVar6 == 0) && (iVar6 = STRING_concat(pSVar13,"},"), iVar6 == 0)) {
                        sVar21 = strlen(pcVar23);
                        local_90.byteArray =
                             (BUFFER_HANDLE)((long)(local_80.byteArray + 0x18) + sVar21);
                        in_RCX = local_80;
                        pSVar14 = local_40;
                        goto LAB_0012afef;
                      }
                    }
                    UNRECOVERED_JUMPTABLE = xlogging_get_log_function();
                    if (UNRECOVERED_JUMPTABLE != (LOGGER_LOG)0x0) {
                      in_RCX = (anon_union_8_2_082bde7f_for_value)0x541;
                      (*UNRECOVERED_JUMPTABLE)
                                (AZ_LOG_ERROR,
                                 "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothubtransporthttp.c"
                                 ,"make1EventJSONitem",0x541,1,"unable to STRING_concat_with_STRING"
                                );
                    }
                    STRING_delete(pSVar13);
                    pSVar13 = (STRING_HANDLE)0x0;
                    pSVar14 = local_40;
LAB_0012afef:
                    STRING_delete(pSVar14);
                  }
                  else {
                    if (IVar8 == IOTHUBMESSAGE_BYTEARRAY) {
                      pSVar13 = STRING_construct("{\"body\":\"");
                      if (pSVar13 != (STRING_HANDLE)0x0) {
                        IVar9 = IoTHubMessage_GetByteArray
                                          ((IOTHUB_MESSAGE_HANDLE)pDVar16[-2].Blink,
                                           (uchar **)&local_80.byteArray,(size_t *)&local_50);
                        if (IVar9 == IOTHUB_MESSAGE_OK) {
                          pSVar14 = Azure_Base64_Encode_Bytes
                                              ((uchar *)local_80.byteArray,(size_t)local_50);
                          if (pSVar14 != (STRING_HANDLE)0x0) {
                            local_58.byteArray = (BUFFER_HANDLE)0x0;
                            iVar6 = STRING_concat_with_STRING(pSVar13,pSVar14);
                            if ((iVar6 == 0) && (iVar6 = STRING_concat(pSVar13,"\""), iVar6 == 0)) {
                              pMVar15 = IoTHubMessage_Properties
                                                  ((IOTHUB_MESSAGE_HANDLE)pDVar16[-2].Blink);
                              iVar6 = concat_Properties(pSVar13,pMVar15,(size_t *)&local_58);
                              if ((iVar6 == 0) && (iVar6 = STRING_concat(pSVar13,"},"), iVar6 == 0))
                              {
                                local_90.byteArray =
                                     (long)(local_50.byteArray + 0x18) + local_58.byteArray;
                                in_RCX = local_58;
                                goto LAB_0012afef;
                              }
                            }
                            STRING_delete(pSVar13);
                            UNRECOVERED_JUMPTABLE = xlogging_get_log_function();
                            if (UNRECOVERED_JUMPTABLE != (LOGGER_LOG)0x0) {
                              in_RCX = (anon_union_8_2_082bde7f_for_value)0x511;
                              (*UNRECOVERED_JUMPTABLE)
                                        (AZ_LOG_ERROR,
                                         "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothubtransporthttp.c"
                                         ,"make1EventJSONitem",0x511,1,
                                         "unable to STRING_concat_with_STRING.");
                            }
                            pSVar13 = (STRING_HANDLE)0x0;
                            goto LAB_0012afef;
                          }
                          UNRECOVERED_JUMPTABLE = xlogging_get_log_function();
                          if (UNRECOVERED_JUMPTABLE != (LOGGER_LOG)0x0) {
                            in_RCX = (anon_union_8_2_082bde7f_for_value)0x501;
                            pcVar23 = "unable to Azure_Base64_Encode_Bytes.";
                            goto LAB_0012b08e;
                          }
                        }
                        else {
                          UNRECOVERED_JUMPTABLE = xlogging_get_log_function();
                          if (UNRECOVERED_JUMPTABLE != (LOGGER_LOG)0x0) {
                            in_RCX = (anon_union_8_2_082bde7f_for_value)0x4f8;
                            pcVar23 = "unable to get the data for the message.";
                            goto LAB_0012b08e;
                          }
                        }
                        goto LAB_0012b093;
                      }
                      UNRECOVERED_JUMPTABLE = xlogging_get_log_function();
                      if (UNRECOVERED_JUMPTABLE != (LOGGER_LOG)0x0) {
                        in_RCX = (anon_union_8_2_082bde7f_for_value)0x4ef;
                        goto LAB_0012af1c;
                      }
                    }
                    else {
                      UNRECOVERED_JUMPTABLE = xlogging_get_log_function();
                      if (UNRECOVERED_JUMPTABLE != (LOGGER_LOG)0x0) {
                        in_RCX = (anon_union_8_2_082bde7f_for_value)0x552;
                        pcVar23 = "an unknown message type was encountered (%d)";
LAB_0012af29:
                        (*UNRECOVERED_JUMPTABLE)
                                  (AZ_LOG_ERROR,
                                   "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothubtransporthttp.c"
                                   ,"make1EventJSONitem",in_RCX._0_4_,1,pcVar23);
                      }
                    }
LAB_0012b09b:
                    pSVar13 = (STRING_HANDLE)0x0;
                  }
                  if (((ulong)local_70 & 1) != 0) {
                    pSVar14 = local_68;
                    if (pSVar13 != (STRING_HANDLE)0x0) {
                      if ((anon_union_8_2_082bde7f_for_value *)0x3fbff < local_90.byteArray) {
                        pDVar20 = DList_RemoveHeadList(deviceData->waitingToSend);
                        pDVar16 = local_78;
                        DList_InsertTailList(local_78,pDVar20);
                        STRING_delete(local_68);
                        STRING_delete(pSVar13);
                        goto LAB_0012b26b;
                      }
                      iVar6 = STRING_concat_with_STRING(local_68,pSVar13);
                      if (iVar6 == 0) {
                        pDVar16 = DList_RemoveHeadList(deviceData->waitingToSend);
                        DList_InsertTailList(local_78,pDVar16);
                        goto LAB_0012b13a;
                      }
                      STRING_delete(local_68);
                      pSVar14 = pSVar13;
                    }
                    STRING_delete(pSVar14);
                    goto LAB_0012b87b;
                  }
                  if (pSVar13 == (STRING_HANDLE)0x0) break;
                  if ((0x3fbff < (ulong)((long)&(local_90.byteArray)->buffer + lVar25)) ||
                     (iVar6 = STRING_concat_with_STRING(local_68,pSVar13), iVar6 != 0)) {
                    STRING_delete(pSVar13);
                    break;
                  }
                  pDVar16 = DList_RemoveHeadList(deviceData->waitingToSend);
                  DList_InsertTailList(local_78,pDVar16);
LAB_0012b13a:
                  lVar25 = (long)&(local_90.byteArray)->buffer + lVar25;
                  STRING_delete(pSVar13);
                  pDVar16 = deviceData->waitingToSend->Flink;
                  in_RCX.byteArray = (BUFFER_HANDLE)0x0;
                } while (pDVar16 != deviceData->waitingToSend);
              }
              pSVar13 = local_68;
              pcVar23 = STRING_c_str(local_68);
              sVar18 = STRING_length(pSVar13);
              pcVar23[sVar18 - 1] = ']';
              pBVar19 = BUFFER_new();
              if (pBVar19 == (BUFFER_HANDLE)0x0) {
                UNRECOVERED_JUMPTABLE = xlogging_get_log_function();
                if (UNRECOVERED_JUMPTABLE != (LOGGER_LOG)0x0) {
                  in_RCX = (anon_union_8_2_082bde7f_for_value)0x5f1;
                  (*UNRECOVERED_JUMPTABLE)
                            (AZ_LOG_ERROR,
                             "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothubtransporthttp.c"
                             ,"DoEvent",0x5f1,1,"unable to BUFFER_new");
                }
                pDVar16 = local_78;
                DList_AppendTailList(deviceData->waitingToSend->Flink,local_78);
                DList_RemoveEntryList(pDVar16);
                DList_InitializeListHead(pDVar16);
              }
              else {
                source_00 = (uchar *)STRING_c_str(pSVar13);
                sVar18 = STRING_length(pSVar13);
                iVar6 = BUFFER_build(pBVar19,source_00,sVar18);
                if (iVar6 == 0) {
                  pHVar3 = deviceData->sasObject;
                  pHVar2 = *(HTTPAPIEX_HANDLE *)((long)handle + 8);
                  in_RCX.byteArray = (BUFFER_HANDLE)STRING_c_str(deviceData->eventHTTPrelativePath);
                  HVar11 = HTTPAPIEX_SAS_ExecuteRequest
                                     (pHVar3,pHVar2,HTTPAPI_REQUEST_POST,(char *)in_RCX.byteArray,
                                      deviceData->eventHTTPrequestHeaders,pBVar19,(uint *)&local_80,
                                      (HTTP_HEADERS_HANDLE)0x0,(BUFFER_HANDLE)0x0);
                  if (HVar11 == HTTPAPIEX_OK) {
                    if (299 < (uint)local_80._0_4_) {
                      UNRECOVERED_JUMPTABLE = xlogging_get_log_function();
                      if (UNRECOVERED_JUMPTABLE != (LOGGER_LOG)0x0) {
                        in_RCX = (anon_union_8_2_082bde7f_for_value)0x618;
                        pcVar23 = "unexpected HTTP status code (%u)";
                        goto LAB_0012b6cd;
                      }
                      goto LAB_0012b6d2;
                    }
                    (**(code **)((long)handle + 0x38))(local_78,0,deviceData->device_transport_ctx);
                  }
                  else {
                    UNRECOVERED_JUMPTABLE = xlogging_get_log_function();
                    if (UNRECOVERED_JUMPTABLE != (LOGGER_LOG)0x0) {
                      in_RCX = (anon_union_8_2_082bde7f_for_value)0x60b;
                      (*UNRECOVERED_JUMPTABLE)
                                (AZ_LOG_ERROR,
                                 "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothubtransporthttp.c"
                                 ,"DoEvent",0x60b,1,"unable to HTTPAPIEX_ExecuteRequest");
                    }
                    pDVar16 = local_78;
                    DList_AppendTailList(deviceData->waitingToSend->Flink,local_78);
                    DList_RemoveEntryList(pDVar16);
                    DList_InitializeListHead(pDVar16);
                  }
                }
                else {
                  UNRECOVERED_JUMPTABLE = xlogging_get_log_function();
                  if (UNRECOVERED_JUMPTABLE != (LOGGER_LOG)0x0) {
                    in_RCX = (anon_union_8_2_082bde7f_for_value)0x5f8;
                    pcVar23 = "unable to BUFFER_build";
LAB_0012b6cd:
                    (*UNRECOVERED_JUMPTABLE)
                              (AZ_LOG_ERROR,
                               "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothubtransporthttp.c"
                               ,"DoEvent",in_RCX._0_4_,1,pcVar23);
                  }
LAB_0012b6d2:
                  pDVar16 = local_78;
                  DList_AppendTailList(deviceData->waitingToSend->Flink,local_78);
                  DList_RemoveEntryList(pDVar16);
                  DList_InitializeListHead(pDVar16);
                }
                BUFFER_delete(pBVar19);
              }
              STRING_delete(pSVar13);
            }
          }
          else {
            UNRECOVERED_JUMPTABLE = xlogging_get_log_function();
            if (UNRECOVERED_JUMPTABLE != (LOGGER_LOG)0x0) {
              in_RCX = (anon_union_8_2_082bde7f_for_value)0x5e5;
              pcVar23 = "unable to HTTPHeaders_ReplaceHeaderNameValuePair";
              goto LAB_0012b8aa;
            }
          }
        }
        else {
          local_48 = (MAP_HANDLE)0x0;
          local_60 = 0;
          pDVar1 = deviceData->waitingToSend->Flink;
          IVar8 = IoTHubMessage_GetContentType((IOTHUB_MESSAGE_HANDLE)pDVar1[-2].Blink);
          if (IVar8 == IOTHUBMESSAGE_STRING) {
            local_48 = (MAP_HANDLE)IoTHubMessage_GetString((IOTHUB_MESSAGE_HANDLE)pDVar1[-2].Blink);
            if (local_48 != (MAP_HANDLE)0x0) {
              local_60 = strlen((char *)local_48);
              goto LAB_0012b243;
            }
            local_60 = 0;
          }
          else if ((IVar8 == IOTHUBMESSAGE_BYTEARRAY) &&
                  (IVar9 = IoTHubMessage_GetByteArray
                                     ((IOTHUB_MESSAGE_HANDLE)pDVar1[-2].Blink,(uchar **)&local_48,
                                      &local_60), IVar9 == IOTHUB_MESSAGE_OK)) {
LAB_0012b243:
            uVar26 = local_60 + 0x180;
            if (uVar26 < 0x3fc00) {
              aVar22.byteArray =
                   (BUFFER_HANDLE)HTTPHeaders_Clone(deviceData->eventHTTPrequestHeaders);
              if ((anon_union_8_2_082bde7f_for_value *)aVar22.byteArray ==
                  (anon_union_8_2_082bde7f_for_value *)0x0) {
                UNRECOVERED_JUMPTABLE = xlogging_get_log_function();
                if (UNRECOVERED_JUMPTABLE != (LOGGER_LOG)0x0) {
                  in_RCX = (anon_union_8_2_082bde7f_for_value)0x662;
                  pcVar23 = "HTTPHeaders_Clone failed";
                  goto LAB_0012b8aa;
                }
              }
              else {
                HVar7 = HTTPHeaders_ReplaceHeaderNameValuePair
                                  ((HTTP_HEADERS_HANDLE)aVar22.byteArray,"Content-Type",
                                   "application/octet-stream");
                if (HVar7 == HTTP_HEADERS_OK) {
                  pMVar15 = IoTHubMessage_Properties((IOTHUB_MESSAGE_HANDLE)pDVar1[-2].Blink);
                  if (pMVar15 == (MAP_HANDLE)0x0) {
                    UNRECOVERED_JUMPTABLE = xlogging_get_log_function();
                    if (UNRECOVERED_JUMPTABLE != (LOGGER_LOG)0x0) {
                      pcVar23 = "set_message_properties";
                      in_RCX = (anon_union_8_2_082bde7f_for_value)0x12b;
                      pcVar24 = "MAP_HANDLE is invalid";
                      goto LAB_0012c061;
                    }
                  }
                  else {
                    in_RCX.byteArray = (BUFFER_HANDLE)&local_58;
                    MVar10 = Map_GetInternals(pMVar15,(char ***)&local_80.string,
                                              (char ***)&local_50.string,(size_t *)in_RCX.string);
                    if (MVar10 == MAP_OK) {
                      local_90.byteArray = aVar22.byteArray;
                      if ((anon_union_8_2_082bde7f_for_value *)local_58.byteArray !=
                          (anon_union_8_2_082bde7f_for_value *)0x0) {
                        pBVar19 = (BUFFER_HANDLE)0x0;
                        do {
                          sVar21 = strlen((char *)((anon_union_8_2_082bde7f_for_value *)
                                                  &(local_50.byteArray)->buffer)[(long)pBVar19].
                                                  byteArray);
                          pMVar15 = (MAP_HANDLE)
                                    ((anon_union_8_2_082bde7f_for_value *)
                                    &(local_80.byteArray)->buffer)[(long)pBVar19].byteArray;
                          local_70 = pBVar19;
                          sVar17 = strlen((char *)pMVar15);
                          uVar26 = sVar17 + sVar21 + uVar26 + 0x10;
                          if (0x3fbff < uVar26) {
                            pDVar16 = DList_RemoveHeadList(deviceData->waitingToSend);
                            DList_InsertTailList(&deviceData->eventConfirmations,pDVar16);
                            (**(code **)((long)handle + 0x38))
                                      (&deviceData->eventConfirmations,3,
                                       deviceData->device_transport_ctx);
                            goto LAB_0012c066;
                          }
                          pSVar13 = STRING_construct_sprintf("%s%s","iothub-app-",pMVar15);
                          if (pSVar13 == (STRING_HANDLE)0x0) {
                            UNRECOVERED_JUMPTABLE = xlogging_get_log_function();
                            if (UNRECOVERED_JUMPTABLE == (LOGGER_LOG)0x0) goto LAB_0012c066;
                            pcVar23 = "set_message_properties";
                            in_RCX = (anon_union_8_2_082bde7f_for_value)0x145;
                            pcVar24 = "Unable to construct app header";
                            goto LAB_0012c061;
                          }
                          pcVar23 = STRING_c_str(pSVar13);
                          pBVar19 = local_70;
                          in_RCX = local_50;
                          HVar7 = HTTPHeaders_ReplaceHeaderNameValuePair
                                            ((HTTP_HEADERS_HANDLE)aVar22.byteArray,pcVar23,
                                             (char *)((anon_union_8_2_082bde7f_for_value *)
                                                     &(local_50.byteArray)->buffer)[(long)local_70].
                                                     byteArray);
                          if (HVar7 != HTTP_HEADERS_OK) {
                            UNRECOVERED_JUMPTABLE = xlogging_get_log_function();
                            if (UNRECOVERED_JUMPTABLE == (LOGGER_LOG)0x0) goto LAB_0012c066;
                            pcVar23 = "set_message_properties";
                            in_RCX = (anon_union_8_2_082bde7f_for_value)0x14d;
                            pcVar24 = "Unable to add app properties to http header";
                            goto LAB_0012c061;
                          }
                          STRING_delete(pSVar13);
                          pBVar19 = (BUFFER_HANDLE)((long)&pBVar19->buffer + 1);
                        } while (pBVar19 < local_58.byteArray);
                      }
                      pcVar23 = IoTHubMessage_GetMessageId((IOTHUB_MESSAGE_HANDLE)pDVar1[-2].Blink);
                      if ((pcVar23 == (char *)0x0) ||
                         (HVar7 = HTTPHeaders_ReplaceHeaderNameValuePair
                                            ((HTTP_HEADERS_HANDLE)aVar22.byteArray,
                                             "iothub-messageid",pcVar23), HVar7 == HTTP_HEADERS_OK))
                      {
                        pcVar23 = IoTHubMessage_GetCorrelationId
                                            ((IOTHUB_MESSAGE_HANDLE)pDVar1[-2].Blink);
                        if ((pcVar23 == (char *)0x0) ||
                           (HVar7 = HTTPHeaders_ReplaceHeaderNameValuePair
                                              ((HTTP_HEADERS_HANDLE)aVar22.byteArray,
                                               "iothub-correlationid",pcVar23),
                           HVar7 == HTTP_HEADERS_OK)) {
                          pcVar23 = IoTHubMessage_GetContentTypeSystemProperty
                                              ((IOTHUB_MESSAGE_HANDLE)pDVar1[-2].Blink);
                          if ((pcVar23 == (char *)0x0) ||
                             (HVar7 = HTTPHeaders_ReplaceHeaderNameValuePair
                                                ((HTTP_HEADERS_HANDLE)aVar22.byteArray,
                                                 "iothub-contenttype",pcVar23),
                             HVar7 == HTTP_HEADERS_OK)) {
                            pcVar23 = IoTHubMessage_GetContentEncodingSystemProperty
                                                ((IOTHUB_MESSAGE_HANDLE)pDVar1[-2].Blink);
                            if ((pcVar23 == (char *)0x0) ||
                               (HVar7 = HTTPHeaders_ReplaceHeaderNameValuePair
                                                  ((HTTP_HEADERS_HANDLE)aVar22.byteArray,
                                                   "iothub-contentencoding",pcVar23),
                               HVar7 == HTTP_HEADERS_OK)) {
                              _Var5 = IoTHubMessage_IsSecurityMessage
                                                ((IOTHUB_MESSAGE_HANDLE)pDVar1[-2].Blink);
                              if ((_Var5) &&
                                 (HVar7 = HTTPHeaders_ReplaceHeaderNameValuePair
                                                    ((HTTP_HEADERS_HANDLE)aVar22.byteArray,
                                                     "iothub-interface-id",
                                                     "urn:azureiot:Security:SecurityAgent:1"),
                                 HVar7 != HTTP_HEADERS_OK)) {
                                UNRECOVERED_JUMPTABLE = xlogging_get_log_function();
                                if (UNRECOVERED_JUMPTABLE != (LOGGER_LOG)0x0) {
                                  pcVar23 = "set_system_properties";
                                  in_RCX = (anon_union_8_2_082bde7f_for_value)0x112;
                                  pcVar24 = "unable to set security message header info";
                                  goto LAB_0012c061;
                                }
                              }
                              else {
                                pBVar19 = BUFFER_create((uchar *)local_48,local_60);
                                if (pBVar19 == (BUFFER_HANDLE)0x0) {
                                  UNRECOVERED_JUMPTABLE = xlogging_get_log_function();
                                  if (UNRECOVERED_JUMPTABLE != (LOGGER_LOG)0x0) {
                                    in_RCX = (anon_union_8_2_082bde7f_for_value)0x67a;
                                    pcVar23 = "unable to BUFFER_new";
LAB_0012c28a:
                                    (*UNRECOVERED_JUMPTABLE)
                                              (AZ_LOG_ERROR,
                                               "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothubtransporthttp.c"
                                               ,"DoEvent",in_RCX._0_4_,1,pcVar23);
                                  }
                                }
                                else {
                                  local_80.byteArray = local_80.byteArray & 0xffffffff00000000;
                                  if (deviceData->deviceSasToken == (STRING_HANDLE)0x0) {
                                    pHVar3 = deviceData->sasObject;
                                    pHVar2 = *(HTTPAPIEX_HANDLE *)((long)handle + 8);
                                    in_RCX.byteArray =
                                         (BUFFER_HANDLE)
                                         STRING_c_str(deviceData->eventHTTPrelativePath);
                                    HVar11 = HTTPAPIEX_SAS_ExecuteRequest
                                                       (pHVar3,pHVar2,HTTPAPI_REQUEST_POST,
                                                        (char *)in_RCX.byteArray,
                                                        (HTTP_HEADERS_HANDLE)aVar22.byteArray,
                                                        pBVar19,(uint *)&local_80,
                                                        (HTTP_HEADERS_HANDLE)0x0,(BUFFER_HANDLE)0x0)
                                    ;
                                    if (HVar11 != HTTPAPIEX_OK) {
                                      UNRECOVERED_JUMPTABLE = xlogging_get_log_function();
                                      if (UNRECOVERED_JUMPTABLE != (LOGGER_LOG)0x0) {
                                        in_RCX = (anon_union_8_2_082bde7f_for_value)0x693;
                                        pcVar23 = "unable to HTTPAPIEX_SAS_ExecuteRequest";
LAB_0012c208:
                                        (*UNRECOVERED_JUMPTABLE)
                                                  (AZ_LOG_ERROR,
                                                                                                      
                                                  "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothubtransporthttp.c"
                                                  ,"DoEvent",in_RCX._0_4_,1,pcVar23);
                                      }
                                      goto LAB_0012c20d;
                                    }
LAB_0012c15e:
                                    if ((uint)local_80._0_4_ < 300) {
                                      pDVar16 = DList_RemoveHeadList(deviceData->waitingToSend);
                                      DList_InsertTailList(&deviceData->eventConfirmations,pDVar16);
                                      (**(code **)((long)handle + 0x38))
                                                (&deviceData->eventConfirmations,0,
                                                 deviceData->device_transport_ctx);
                                    }
                                    else {
                                      UNRECOVERED_JUMPTABLE = xlogging_get_log_function();
                                      if (UNRECOVERED_JUMPTABLE != (LOGGER_LOG)0x0) {
                                        in_RCX = (anon_union_8_2_082bde7f_for_value)0x6a0;
                                        pcVar23 = "unexpected HTTP status code (%u)";
                                        goto LAB_0012c28a;
                                      }
                                    }
                                  }
                                  else {
                                    pcVar23 = STRING_c_str(deviceData->deviceSasToken);
                                    HVar7 = HTTPHeaders_ReplaceHeaderNameValuePair
                                                      ((HTTP_HEADERS_HANDLE)aVar22.byteArray,
                                                       "Authorization",pcVar23);
                                    if (HVar7 == HTTP_HEADERS_OK) {
                                      pHVar2 = *(HTTPAPIEX_HANDLE *)((long)handle + 8);
                                      pcVar23 = STRING_c_str(deviceData->eventHTTPrelativePath);
                                      in_RCX.byteArray = aVar22.byteArray;
                                      HVar11 = HTTPAPIEX_ExecuteRequest
                                                         (pHVar2,HTTPAPI_REQUEST_POST,pcVar23,
                                                          (HTTP_HEADERS_HANDLE)aVar22.byteArray,
                                                          pBVar19,(uint *)&local_80,
                                                          (HTTP_HEADERS_HANDLE)0x0,
                                                          (BUFFER_HANDLE)0x0);
                                      if (HVar11 == HTTPAPIEX_OK) goto LAB_0012c15e;
                                      UNRECOVERED_JUMPTABLE = xlogging_get_log_function();
                                      if (UNRECOVERED_JUMPTABLE != (LOGGER_LOG)0x0) {
                                        in_RCX = (anon_union_8_2_082bde7f_for_value)0x68b;
                                        pcVar23 = "Unable to HTTPAPIEX_ExecuteRequest.";
                                        goto LAB_0012c208;
                                      }
LAB_0012c20d:
                                      if (HVar11 == HTTPAPIEX_RECOVERYFAILED) {
                                        pDVar16 = DList_RemoveHeadList(deviceData->waitingToSend);
                                        DList_InsertTailList
                                                  (&deviceData->eventConfirmations,pDVar16);
                                        (**(code **)((long)handle + 0x38))
                                                  (&deviceData->eventConfirmations,3,
                                                   deviceData->device_transport_ctx);
                                      }
                                    }
                                    else {
                                      UNRECOVERED_JUMPTABLE = xlogging_get_log_function();
                                      if (UNRECOVERED_JUMPTABLE != (LOGGER_LOG)0x0) {
                                        in_RCX = (anon_union_8_2_082bde7f_for_value)0x685;
                                        pcVar23 = "Unable to replace the old SAS Token.";
                                        goto LAB_0012c28a;
                                      }
                                    }
                                  }
                                }
                                BUFFER_delete(pBVar19);
                              }
                            }
                            else {
                              UNRECOVERED_JUMPTABLE = xlogging_get_log_function();
                              if (UNRECOVERED_JUMPTABLE != (LOGGER_LOG)0x0) {
                                pcVar23 = "set_system_properties";
                                in_RCX = (anon_union_8_2_082bde7f_for_value)0x10d;
                                pcVar24 = 
                                "unable to HTTPHeaders_ReplaceHeaderNameValuePair (content-encoding)"
                                ;
                                goto LAB_0012c061;
                              }
                            }
                          }
                          else {
                            UNRECOVERED_JUMPTABLE = xlogging_get_log_function();
                            if (UNRECOVERED_JUMPTABLE != (LOGGER_LOG)0x0) {
                              pcVar23 = "set_system_properties";
                              in_RCX = (anon_union_8_2_082bde7f_for_value)0x108;
                              pcVar24 = 
                              "unable to HTTPHeaders_ReplaceHeaderNameValuePair (content-type)";
                              goto LAB_0012c061;
                            }
                          }
                        }
                        else {
                          UNRECOVERED_JUMPTABLE = xlogging_get_log_function();
                          if (UNRECOVERED_JUMPTABLE != (LOGGER_LOG)0x0) {
                            in_RCX = (anon_union_8_2_082bde7f_for_value)0x103;
                            goto LAB_0012beb8;
                          }
                        }
                      }
                      else {
                        UNRECOVERED_JUMPTABLE = xlogging_get_log_function();
                        if (UNRECOVERED_JUMPTABLE != (LOGGER_LOG)0x0) {
                          in_RCX = (anon_union_8_2_082bde7f_for_value)0xfe;
LAB_0012beb8:
                          pcVar23 = "set_system_properties";
                          pcVar24 = "unable to HTTPHeaders_ReplaceHeaderNameValuePair";
                          goto LAB_0012c061;
                        }
                      }
                    }
                    else {
                      UNRECOVERED_JUMPTABLE = xlogging_get_log_function();
                      if (UNRECOVERED_JUMPTABLE != (LOGGER_LOG)0x0) {
                        pcVar23 = "set_message_properties";
                        in_RCX = (anon_union_8_2_082bde7f_for_value)0x130;
                        pcVar24 = "unable to Map_GetInternals";
                        goto LAB_0012c061;
                      }
                    }
                  }
                }
                else {
                  UNRECOVERED_JUMPTABLE = xlogging_get_log_function();
                  if (UNRECOVERED_JUMPTABLE != (LOGGER_LOG)0x0) {
                    pcVar23 = "DoEvent";
                    in_RCX = (anon_union_8_2_082bde7f_for_value)0x668;
                    pcVar24 = "HTTPHeaders_ReplaceHeaderNameValuePair failed";
LAB_0012c061:
                    (*UNRECOVERED_JUMPTABLE)
                              (AZ_LOG_ERROR,
                               "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothubtransporthttp.c"
                               ,pcVar23,in_RCX._0_4_,1,pcVar24);
                  }
                }
LAB_0012c066:
                HTTPHeaders_Free((HTTP_HEADERS_HANDLE)aVar22.byteArray);
              }
            }
            else {
              pDVar20 = DList_RemoveHeadList(deviceData->waitingToSend);
              pDVar16 = &deviceData->eventConfirmations;
              DList_InsertTailList(pDVar16,pDVar20);
LAB_0012b26b:
              (**(code **)((long)handle + 0x38))(pDVar16,3,deviceData->device_transport_ctx);
            }
            goto LAB_0012b8af;
          }
          UNRECOVERED_JUMPTABLE = xlogging_get_log_function();
          if (UNRECOVERED_JUMPTABLE != (LOGGER_LOG)0x0) {
            in_RCX = (anon_union_8_2_082bde7f_for_value)0x652;
            pcVar23 = "unable to get the message content";
LAB_0012b8aa:
            (*UNRECOVERED_JUMPTABLE)
                      (AZ_LOG_ERROR,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothubtransporthttp.c"
                       ,"DoEvent",in_RCX._0_4_,1,pcVar23);
          }
        }
LAB_0012b8af:
        if ((deviceData->DoWork_PullMessage == true) &&
           ((stopTime = get_time((time_t *)0x0), stopTime == -1 || deviceData->isFirstPoll != false
            || (dVar27 = get_difftime(stopTime,deviceData->lastPollTime),
               (double)*(uint *)((long)handle + 0x14) < dVar27)))) {
          responseHeadersHandle = HTTPHeaders_Alloc();
          if (responseHeadersHandle == (HTTP_HEADERS_HANDLE)0x0) {
            UNRECOVERED_JUMPTABLE = xlogging_get_log_function();
            if (UNRECOVERED_JUMPTABLE != (LOGGER_LOG)0x0) {
              in_RCX = (anon_union_8_2_082bde7f_for_value)0x77d;
              (*UNRECOVERED_JUMPTABLE)
                        (AZ_LOG_ERROR,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothubtransporthttp.c"
                         ,"DoMessages",0x77d,1,"unable to HTTPHeaders_Alloc");
            }
          }
          else {
            local_70 = BUFFER_new();
            if (local_70 == (BUFFER_HANDLE)0x0) {
              UNRECOVERED_JUMPTABLE = xlogging_get_log_function();
              if (UNRECOVERED_JUMPTABLE != (LOGGER_LOG)0x0) {
                in_RCX = (anon_union_8_2_082bde7f_for_value)0x784;
                (*UNRECOVERED_JUMPTABLE)
                          (AZ_LOG_ERROR,
                           "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothubtransporthttp.c"
                           ,"DoMessages",0x784,1,"unable to BUFFER_new");
              }
            }
            else {
              local_80.byteArray = local_80.byteArray & 0xffffffff00000000;
              if (deviceData->deviceSasToken == (STRING_HANDLE)0x0) {
                pHVar3 = deviceData->sasObject;
                pHVar2 = *(HTTPAPIEX_HANDLE *)((long)handle + 8);
                in_RCX.byteArray = (BUFFER_HANDLE)STRING_c_str(deviceData->messageHTTPrelativePath);
                HVar11 = HTTPAPIEX_SAS_ExecuteRequest
                                   (pHVar3,pHVar2,HTTPAPI_REQUEST_GET,(char *)in_RCX.byteArray,
                                    deviceData->messageHTTPrequestHeaders,(BUFFER_HANDLE)0x0,
                                    (uint *)&local_80,responseHeadersHandle,local_70);
                if (HVar11 == HTTPAPIEX_OK) {
LAB_0012ba93:
                  if (stopTime != -1) {
                    deviceData->lastPollTime = stopTime;
                  }
                  deviceData->isFirstPoll = stopTime == -1;
                  if (local_80._0_4_ == 200) {
                    pcVar23 = HTTPHeaders_FindHeaderValue(responseHeadersHandle,"ETag");
                    if (pcVar23 == (char *)0x0) {
                      UNRECOVERED_JUMPTABLE = xlogging_get_log_function();
                      if (UNRECOVERED_JUMPTABLE != (LOGGER_LOG)0x0) {
                        in_RCX = (anon_union_8_2_082bde7f_for_value)0x7c8;
                        pcVar23 = "unable to find a received header called \"E-Tag\"";
                        goto LAB_0012bc92;
                      }
                    }
                    else {
                      sVar21 = strlen(pcVar23);
                      pBVar19 = local_70;
                      if (((sVar21 < 2) || (*pcVar23 != '\"')) || (pcVar23[sVar21 - 1] != '\"')) {
                        UNRECOVERED_JUMPTABLE = xlogging_get_log_function();
                        if (UNRECOVERED_JUMPTABLE != (LOGGER_LOG)0x0) {
                          in_RCX = (anon_union_8_2_082bde7f_for_value)0x7d3;
                          pcVar23 = "ETag is not a valid quoted string";
                          goto LAB_0012bc92;
                        }
                      }
                      else {
                        local_90.byteArray = (BUFFER_HANDLE)BUFFER_u_char(local_70);
                        sVar18 = BUFFER_length(pBVar19);
                        aVar22.byteArray =
                             (BUFFER_HANDLE)
                             IoTHubMessage_CreateFromByteArray((uchar *)local_90.byteArray,sVar18);
                        if ((anon_union_8_2_082bde7f_for_value *)aVar22.byteArray ==
                            (anon_union_8_2_082bde7f_for_value *)0x0) {
                          UNRECOVERED_JUMPTABLE = xlogging_get_log_function();
                          if (UNRECOVERED_JUMPTABLE != (LOGGER_LOG)0x0) {
                            (*UNRECOVERED_JUMPTABLE)
                                      (AZ_LOG_ERROR,
                                       "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothubtransporthttp.c"
                                       ,"DoMessages",0x7df,1,
                                       "unable to IoTHubMessage_CreateFromByteArray, trying to abandon the message... "
                                      );
                          }
                        }
                        else {
                          iVar6 = retrieve_message_properties
                                            (responseHeadersHandle,
                                             (IOTHUB_MESSAGE_HANDLE)aVar22.byteArray);
                          if (iVar6 == 0) {
                            dispositionContext = CreateMessageDispositionContext(pcVar23);
                            local_90.byteArray = aVar22.byteArray;
                            if (dispositionContext == (MESSAGE_DISPOSITION_CONTEXT *)0x0) {
                              UNRECOVERED_JUMPTABLE = xlogging_get_log_function();
                              if (UNRECOVERED_JUMPTABLE != (LOGGER_LOG)0x0) {
                                iVar6 = 0x7ef;
                                pcVar24 = "failed to create disposition context";
                                goto LAB_0012bc28;
                              }
                            }
                            else {
                              IVar9 = IoTHubMessage_SetDispositionContext
                                                ((IOTHUB_MESSAGE_HANDLE)aVar22.byteArray,
                                                 dispositionContext,DestroyMessageDispositionContext
                                                );
                              if (IVar9 == IOTHUB_MESSAGE_OK) {
                                cVar4 = (**(code **)((long)handle + 0x28))
                                                  (aVar22.byteArray,deviceData->device_transport_ctx
                                                  );
                                if (cVar4 != '\0') goto LAB_0012bc97;
                                UNRECOVERED_JUMPTABLE = xlogging_get_log_function();
                                if (UNRECOVERED_JUMPTABLE != (LOGGER_LOG)0x0) {
                                  iVar6 = 0x7fc;
                                  pcVar24 = "IoTHubClientCore_LL_MessageCallback failed";
                                  goto LAB_0012bc28;
                                }
                              }
                              else {
                                UNRECOVERED_JUMPTABLE = xlogging_get_log_function();
                                if (UNRECOVERED_JUMPTABLE != (LOGGER_LOG)0x0) {
                                  (*UNRECOVERED_JUMPTABLE)
                                            (AZ_LOG_ERROR,
                                             "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothubtransporthttp.c"
                                             ,"DoMessages",0x7f6,1,
                                             "Failed setting disposition context in IOTHUB_MESSAGE_HANDLE"
                                            );
                                }
                                free(dispositionContext->etagValue);
                                free(dispositionContext);
                              }
                            }
                          }
                          else {
                            UNRECOVERED_JUMPTABLE = xlogging_get_log_function();
                            if (UNRECOVERED_JUMPTABLE != (LOGGER_LOG)0x0) {
                              iVar6 = 0x7e6;
                              pcVar24 = "Failed retrieving message properties";
LAB_0012bc28:
                              (*UNRECOVERED_JUMPTABLE)
                                        (AZ_LOG_ERROR,
                                         "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothubtransporthttp.c"
                                         ,"DoMessages",iVar6,1,pcVar24);
                            }
                          }
                          IoTHubMessage_Destroy((IOTHUB_MESSAGE_HANDLE)aVar22.byteArray);
                        }
                        in_RCX.byteArray = (BUFFER_HANDLE)0x0;
                        _Var5 = abandonOrAcceptMessage
                                          ((HTTPTRANSPORT_HANDLE_DATA *)handle,deviceData,pcVar23,
                                           IOTHUBMESSAGE_ABANDONED);
                        if ((!_Var5) &&
                           (UNRECOVERED_JUMPTABLE = xlogging_get_log_function(),
                           UNRECOVERED_JUMPTABLE != (LOGGER_LOG)0x0)) {
                          in_RCX = (anon_union_8_2_082bde7f_for_value)0x80f;
                          pcVar23 = "HTTP Transport layer failed to report ABANDON disposition";
LAB_0012bc92:
                          (*UNRECOVERED_JUMPTABLE)
                                    (AZ_LOG_ERROR,
                                     "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothubtransporthttp.c"
                                     ,"DoMessages",in_RCX._0_4_,1,pcVar23);
                        }
                      }
                    }
                  }
                  else if ((local_80._0_4_ != 0xcc) &&
                          (UNRECOVERED_JUMPTABLE = xlogging_get_log_function(),
                          UNRECOVERED_JUMPTABLE != (LOGGER_LOG)0x0)) {
                    in_RCX = (anon_union_8_2_082bde7f_for_value)0x7c1;
                    pcVar23 = 
                    "expected status code was 200, but actually was received %u... moving on";
                    goto LAB_0012bc92;
                  }
                }
                else {
                  UNRECOVERED_JUMPTABLE = xlogging_get_log_function();
                  if (UNRECOVERED_JUMPTABLE != (LOGGER_LOG)0x0) {
                    in_RCX = (anon_union_8_2_082bde7f_for_value)0x7ab;
                    pcVar23 = "unable to HTTPAPIEX_SAS_ExecuteRequest";
                    goto LAB_0012bc92;
                  }
                }
              }
              else {
                httpHeadersHandle = deviceData->messageHTTPrequestHeaders;
                pcVar23 = STRING_c_str(deviceData->deviceSasToken);
                HVar7 = HTTPHeaders_ReplaceHeaderNameValuePair
                                  (httpHeadersHandle,"Authorization",pcVar23);
                if (HVar7 == HTTP_HEADERS_OK) {
                  pHVar2 = *(HTTPAPIEX_HANDLE *)((long)handle + 8);
                  pcVar23 = STRING_c_str(deviceData->messageHTTPrelativePath);
                  in_RCX = (anon_union_8_2_082bde7f_for_value)deviceData->messageHTTPrequestHeaders;
                  HVar11 = HTTPAPIEX_ExecuteRequest
                                     (pHVar2,HTTPAPI_REQUEST_GET,pcVar23,
                                      (HTTP_HEADERS_HANDLE)in_RCX.byteArray,(BUFFER_HANDLE)0x0,
                                      (uint *)&local_80,responseHeadersHandle,local_70);
                  if (HVar11 == HTTPAPIEX_OK) goto LAB_0012ba93;
                  UNRECOVERED_JUMPTABLE = xlogging_get_log_function();
                  if (UNRECOVERED_JUMPTABLE != (LOGGER_LOG)0x0) {
                    in_RCX = (anon_union_8_2_082bde7f_for_value)0x79c;
                    pcVar23 = "Unable to HTTPAPIEX_ExecuteRequest.";
                    goto LAB_0012bc92;
                  }
                }
                else {
                  UNRECOVERED_JUMPTABLE = xlogging_get_log_function();
                  if (UNRECOVERED_JUMPTABLE != (LOGGER_LOG)0x0) {
                    in_RCX = (anon_union_8_2_082bde7f_for_value)0x78f;
                    pcVar23 = "Unable to replace the old SAS Token.";
                    goto LAB_0012bc92;
                  }
                }
              }
LAB_0012bc97:
              BUFFER_delete(local_70);
            }
            HTTPHeaders_Free(responseHeadersHandle);
          }
        }
        index = index + 1;
      } while (index != local_38);
    }
  }
  return;
}

Assistant:

static void IoTHubTransportHttp_DoWork(TRANSPORT_LL_HANDLE handle)
{
    if (handle != NULL)
    {
        HTTPTRANSPORT_HANDLE_DATA* handleData = (HTTPTRANSPORT_HANDLE_DATA*)handle;
        IOTHUB_DEVICE_HANDLE* listItem;
        size_t deviceListSize = VECTOR_size(handleData->perDeviceList);
        for (size_t i = 0; i < deviceListSize; i++)
        {
            listItem = (IOTHUB_DEVICE_HANDLE *)VECTOR_element(handleData->perDeviceList, i);
            HTTPTRANSPORT_PERDEVICE_DATA* perDeviceItem = *(HTTPTRANSPORT_PERDEVICE_DATA**)(listItem);
            DoEvent(handleData, perDeviceItem);
            DoMessages(handleData, perDeviceItem);
        }
    }
    else
    {
        LogError("Invalid Argument NULL call on DoWork.");
    }
}